

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlendMode.cpp
# Opt level: O1

bool sf::operator==(BlendMode *left,BlendMode *right)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5[0] = -((char)right->colorSrcFactor == (char)left->colorSrcFactor);
  auVar5[1] = -(*(byte *)((long)&right->colorSrcFactor + 1) ==
               *(byte *)((long)&left->colorSrcFactor + 1));
  auVar5[2] = -(*(byte *)((long)&right->colorSrcFactor + 2) ==
               *(byte *)((long)&left->colorSrcFactor + 2));
  auVar5[3] = -(*(byte *)((long)&right->colorSrcFactor + 3) ==
               *(byte *)((long)&left->colorSrcFactor + 3));
  auVar5[4] = -((char)right->colorDstFactor == (char)left->colorDstFactor);
  auVar5[5] = -(*(byte *)((long)&right->colorDstFactor + 1) ==
               *(byte *)((long)&left->colorDstFactor + 1));
  auVar5[6] = -(*(byte *)((long)&right->colorDstFactor + 2) ==
               *(byte *)((long)&left->colorDstFactor + 2));
  auVar5[7] = -(*(byte *)((long)&right->colorDstFactor + 3) ==
               *(byte *)((long)&left->colorDstFactor + 3));
  auVar5[8] = -((char)right->colorEquation == (char)left->colorEquation);
  auVar5[9] = -(*(byte *)((long)&right->colorEquation + 1) ==
               *(byte *)((long)&left->colorEquation + 1));
  auVar5[10] = -(*(byte *)((long)&right->colorEquation + 2) ==
                *(byte *)((long)&left->colorEquation + 2));
  auVar5[0xb] = -(*(byte *)((long)&right->colorEquation + 3) ==
                 *(byte *)((long)&left->colorEquation + 3));
  auVar5[0xc] = -((char)right->alphaSrcFactor == (char)left->alphaSrcFactor);
  auVar5[0xd] = -(*(byte *)((long)&right->alphaSrcFactor + 1) ==
                 *(byte *)((long)&left->alphaSrcFactor + 1));
  auVar5[0xe] = -(*(byte *)((long)&right->alphaSrcFactor + 2) ==
                 *(byte *)((long)&left->alphaSrcFactor + 2));
  auVar5[0xf] = -(*(byte *)((long)&right->alphaSrcFactor + 3) ==
                 *(byte *)((long)&left->alphaSrcFactor + 3));
  uVar1 = left->alphaDstFactor;
  uVar3 = left->alphaEquation;
  uVar2 = right->alphaDstFactor;
  uVar4 = right->alphaEquation;
  auVar6[0] = -((char)uVar2 == (char)uVar1);
  auVar6[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
  auVar6[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
  auVar6[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
  auVar6[4] = -((char)uVar4 == (char)uVar3);
  auVar6[5] = -((char)((uint)uVar4 >> 8) == (char)((uint)uVar3 >> 8));
  auVar6[6] = -((char)((uint)uVar4 >> 0x10) == (char)((uint)uVar3 >> 0x10));
  auVar6[7] = -((char)((uint)uVar4 >> 0x18) == (char)((uint)uVar3 >> 0x18));
  auVar6[8] = 0xff;
  auVar6[9] = 0xff;
  auVar6[10] = 0xff;
  auVar6[0xb] = 0xff;
  auVar6[0xc] = 0xff;
  auVar6[0xd] = 0xff;
  auVar6[0xe] = 0xff;
  auVar6[0xf] = 0xff;
  auVar6 = auVar6 & auVar5;
  return (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
}

Assistant:

bool operator ==(const BlendMode& left, const BlendMode& right)
{
    return (left.colorSrcFactor == right.colorSrcFactor) &&
           (left.colorDstFactor == right.colorDstFactor) &&
           (left.colorEquation  == right.colorEquation)  &&
           (left.alphaSrcFactor == right.alphaSrcFactor) &&
           (left.alphaDstFactor == right.alphaDstFactor) &&
           (left.alphaEquation  == right.alphaEquation);
}